

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void dr_prediction_z3_16x32_avx2
               (uint8_t *dst,ptrdiff_t stride,uint8_t *left,int upsample_left,int dy)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  int iVar21;
  undefined8 *puVar22;
  long lVar23;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  int j_1;
  __m256i d [16];
  __m256i dstvec [16];
  int mdiff;
  int jj;
  int j;
  __m256i shift;
  int i;
  int base_max_diff;
  int base;
  __m128i a1_128;
  __m128i a0_128;
  __m256i res16 [2];
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m256i c3f;
  __m256i diff;
  __m256i a_mbase_x;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  int local_b24;
  undefined8 local_b20 [61];
  __m256i *in_stack_fffffffffffff6c8;
  __m256i *in_stack_fffffffffffff6d0;
  undefined1 local_920 [528];
  long local_710;
  long local_708;
  int local_68c;
  int local_688;
  int local_684;
  undefined1 local_680 [32];
  int local_64c;
  int local_648;
  int local_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620 [4];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  int local_588;
  uint local_584;
  undefined1 local_580 [16];
  undefined1 auStack_570 [16];
  undefined1 local_560 [32];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  int local_488;
  undefined4 local_484;
  uint local_480;
  long local_478;
  undefined1 *local_470;
  int local_464;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  ushort local_3c8;
  undefined2 local_3c6;
  undefined2 local_3c4;
  byte local_3c1;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined1 local_380 [16];
  undefined1 auStack_370 [16];
  undefined2 local_360;
  undefined2 local_35e;
  undefined2 local_35c;
  undefined2 local_35a;
  undefined2 local_358;
  undefined2 local_356;
  undefined2 local_354;
  undefined2 local_352;
  undefined2 local_350;
  undefined2 local_34e;
  undefined2 local_34c;
  undefined2 local_34a;
  undefined2 local_348;
  undefined2 local_346;
  undefined2 local_344;
  undefined2 local_342;
  undefined1 local_340 [32];
  undefined2 local_320;
  undefined2 local_31e;
  undefined2 local_31c;
  undefined2 local_31a;
  undefined2 local_318;
  undefined2 local_316;
  undefined2 local_314;
  undefined2 local_312;
  undefined2 local_310;
  undefined2 local_30e;
  undefined2 local_30c;
  undefined2 local_30a;
  undefined2 local_308;
  undefined2 local_306;
  undefined2 local_304;
  undefined2 local_302;
  undefined1 local_300 [32];
  ushort local_2e0;
  ushort local_2de;
  ushort local_2dc;
  ushort local_2da;
  ushort local_2d8;
  ushort local_2d6;
  ushort local_2d4;
  ushort local_2d2;
  ushort local_2d0;
  ushort local_2ce;
  ushort local_2cc;
  ushort local_2ca;
  ushort local_2c8;
  ushort local_2c6;
  ushort local_2c4;
  ushort local_2c2;
  undefined1 local_2c0 [16];
  undefined1 auStack_2b0 [16];
  byte local_2a0;
  byte local_29f;
  byte local_29e;
  byte local_29d;
  byte local_29c;
  byte local_29b;
  byte local_29a;
  byte local_299;
  byte local_298;
  byte local_297;
  byte local_296;
  byte local_295;
  byte local_294;
  byte local_293;
  byte local_292;
  byte local_291;
  byte local_290;
  byte local_28f;
  byte local_28e;
  byte local_28d;
  byte local_28c;
  byte local_28b;
  byte local_28a;
  byte local_289;
  byte local_288;
  byte local_287;
  byte local_286;
  byte local_285;
  byte local_284;
  byte local_283;
  byte local_282;
  byte local_281;
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 auStack_1d0 [16];
  undefined1 (*local_1b8) [16];
  undefined1 (*local_1b0) [16];
  undefined4 local_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined4 local_164;
  undefined1 local_160 [32];
  undefined4 local_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined1 local_a0 [16];
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  auVar19._8_8_ = auStack_1f0._8_8_;
  auVar19._0_8_ = auStack_1f0._0_8_;
  auVar18._8_8_ = local_200._8_8_;
  auVar18._0_8_ = local_200._0_8_;
  auVar25._8_8_ = local_a0._8_8_;
  auVar25._0_8_ = local_a0._0_8_;
  auVar24._24_8_ = auStack_1d0._8_8_;
  auVar24._16_8_ = auStack_1d0._0_8_;
  auVar24._8_8_ = local_1e0._8_8_;
  auVar24._0_8_ = local_1e0._0_8_;
  local_464 = 0x10;
  local_470 = local_920;
  local_484 = 6;
  local_488 = 0x2f;
  local_3c4 = 0x10;
  local_342 = 0x10;
  local_344 = 0x10;
  local_346 = 0x10;
  local_348 = 0x10;
  local_34a = 0x10;
  local_34c = 0x10;
  local_34e = 0x10;
  local_350 = 0x10;
  local_352 = 0x10;
  local_354 = 0x10;
  local_356 = 0x10;
  local_358 = 0x10;
  local_35a = 0x10;
  local_35c = 0x10;
  local_35e = 0x10;
  local_360 = 0x10;
  auVar1 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar1 = vpinsrw_avx(auVar1,0x10,2);
  auVar1 = vpinsrw_avx(auVar1,0x10,3);
  auVar1 = vpinsrw_avx(auVar1,0x10,4);
  auVar1 = vpinsrw_avx(auVar1,0x10,5);
  auVar1 = vpinsrw_avx(auVar1,0x10,6);
  local_380 = vpinsrw_avx(auVar1,0x10,7);
  auVar1 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar1 = vpinsrw_avx(auVar1,0x10,2);
  auVar1 = vpinsrw_avx(auVar1,0x10,3);
  auVar1 = vpinsrw_avx(auVar1,0x10,4);
  auVar1 = vpinsrw_avx(auVar1,0x10,5);
  auVar1 = vpinsrw_avx(auVar1,0x10,6);
  auStack_370 = vpinsrw_avx(auVar1,0x10,7);
  local_520 = local_380._0_8_;
  uStack_518 = local_380._8_8_;
  uStack_510 = auStack_370._0_8_;
  uStack_508 = auStack_370._8_8_;
  local_3c1 = *(byte *)(in_RDX + 0x2f);
  auVar1 = vpinsrb_avx(ZEXT116(local_3c1),(uint)local_3c1,1);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,2);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,3);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,4);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,5);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,6);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,7);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,8);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,9);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,10);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,0xb);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,0xc);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,0xd);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,0xe);
  local_2c0 = vpinsrb_avx(auVar1,(uint)local_3c1,0xf);
  auVar1 = vpinsrb_avx(ZEXT116(local_3c1),(uint)local_3c1,1);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,2);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,3);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,4);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,5);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,6);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,7);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,8);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,9);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,10);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,0xb);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,0xc);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,0xd);
  auVar1 = vpinsrb_avx(auVar1,(uint)local_3c1,0xe);
  auStack_2b0 = vpinsrb_avx(auVar1,(uint)local_3c1,0xf);
  local_540 = local_2c0._0_8_;
  uStack_538 = local_2c0._8_8_;
  uStack_530 = auStack_2b0._0_8_;
  uStack_528 = auStack_2b0._8_8_;
  local_3c6 = 0x3f;
  local_302 = 0x3f;
  local_304 = 0x3f;
  local_306 = 0x3f;
  local_308 = 0x3f;
  local_30a = 0x3f;
  local_30c = 0x3f;
  local_30e = 0x3f;
  local_310 = 0x3f;
  local_312 = 0x3f;
  local_314 = 0x3f;
  local_316 = 0x3f;
  local_318 = 0x3f;
  local_31a = 0x3f;
  local_31c = 0x3f;
  local_31e = 0x3f;
  local_320 = 0x3f;
  auVar1 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar1 = vpinsrw_avx(auVar1,0x3f,2);
  auVar1 = vpinsrw_avx(auVar1,0x3f,3);
  auVar1 = vpinsrw_avx(auVar1,0x3f,4);
  auVar1 = vpinsrw_avx(auVar1,0x3f,5);
  auVar1 = vpinsrw_avx(auVar1,0x3f,6);
  auVar1 = vpinsrw_avx(auVar1,0x3f,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar2 = vpinsrw_avx(auVar2,0x3f,2);
  auVar2 = vpinsrw_avx(auVar2,0x3f,3);
  auVar2 = vpinsrw_avx(auVar2,0x3f,4);
  auVar2 = vpinsrw_avx(auVar2,0x3f,5);
  auVar2 = vpinsrw_avx(auVar2,0x3f,6);
  auVar2 = vpinsrw_avx(auVar2,0x3f,7);
  local_340._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  local_340._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  local_588 = 0;
  local_584 = in_R8D;
  local_480 = in_R8D;
  local_478 = in_RDX;
  local_2a0 = local_3c1;
  local_29f = local_3c1;
  local_29e = local_3c1;
  local_29d = local_3c1;
  local_29c = local_3c1;
  local_29b = local_3c1;
  local_29a = local_3c1;
  local_299 = local_3c1;
  local_298 = local_3c1;
  local_297 = local_3c1;
  local_296 = local_3c1;
  local_295 = local_3c1;
  local_294 = local_3c1;
  local_293 = local_3c1;
  local_292 = local_3c1;
  local_291 = local_3c1;
  local_290 = local_3c1;
  local_28f = local_3c1;
  local_28e = local_3c1;
  local_28d = local_3c1;
  local_28c = local_3c1;
  local_28b = local_3c1;
  local_28a = local_3c1;
  local_289 = local_3c1;
  local_288 = local_3c1;
  local_287 = local_3c1;
  local_286 = local_3c1;
  local_285 = local_3c1;
  local_284 = local_3c1;
  local_283 = local_3c1;
  local_282 = local_3c1;
  local_281 = local_3c1;
  auVar1 = local_340._0_16_;
  auVar2 = local_340._16_16_;
  while( true ) {
    auStack_570._8_8_ = auVar2._8_8_;
    auStack_570._0_8_ = auVar2._0_8_;
    if (local_464 <= local_588) goto LAB_003a5d1b;
    iVar20 = (int)local_584 >> 6;
    iVar21 = local_488 - iVar20;
    local_648 = iVar21;
    local_644 = iVar20;
    if (iVar21 < 1) break;
    if (0x20 < iVar21) {
      local_648 = 0x20;
    }
    local_3c8 = (ushort)local_584;
    local_2c2 = (ushort)local_584;
    local_2c4 = (ushort)local_584;
    local_2c6 = (ushort)local_584;
    local_2c8 = (ushort)local_584;
    local_2ca = (ushort)local_584;
    local_2cc = (ushort)local_584;
    local_2ce = (ushort)local_584;
    local_2d0 = (ushort)local_584;
    local_2d2 = (ushort)local_584;
    local_2d4 = (ushort)local_584;
    local_2d6 = (ushort)local_584;
    local_2d8 = (ushort)local_584;
    local_2da = (ushort)local_584;
    local_2dc = (ushort)local_584;
    local_2de = (ushort)local_584;
    local_2e0 = (ushort)local_584;
    auVar24._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_584),local_584 & 0xffff,1);
    auVar24._0_16_ = vpinsrw_avx(auVar24._0_16_,local_584 & 0xffff,2);
    auVar24._0_16_ = vpinsrw_avx(auVar24._0_16_,local_584 & 0xffff,3);
    auVar24._0_16_ = vpinsrw_avx(auVar24._0_16_,local_584 & 0xffff,4);
    auVar24._0_16_ = vpinsrw_avx(auVar24._0_16_,local_584 & 0xffff,5);
    auVar24._0_16_ = vpinsrw_avx(auVar24._0_16_,local_584 & 0xffff,6);
    auVar24._16_16_ = vpinsrw_avx(auVar24._0_16_,local_584 & 0xffff,7);
    auVar24._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_584),local_584 & 0xffff,1);
    auVar24._0_16_ = vpinsrw_avx(auVar24._0_16_,local_584 & 0xffff,2);
    auVar24._0_16_ = vpinsrw_avx(auVar24._0_16_,local_584 & 0xffff,3);
    auVar24._0_16_ = vpinsrw_avx(auVar24._0_16_,local_584 & 0xffff,4);
    auVar24._0_16_ = vpinsrw_avx(auVar24._0_16_,local_584 & 0xffff,5);
    auVar24._0_16_ = vpinsrw_avx(auVar24._0_16_,local_584 & 0xffff,6);
    auVar24._0_16_ = vpinsrw_avx(auVar24._0_16_,local_584 & 0xffff,7);
    auVar24._0_16_ = ZEXT116(0) * auVar24._16_16_ + ZEXT116(1) * auVar24._0_16_;
    auVar24._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24._16_16_;
    local_300._16_8_ = auVar24._16_8_;
    local_300._24_8_ = auVar24._24_8_;
    auVar3._16_8_ = local_300._16_8_;
    auVar3._0_16_ = auVar24._0_16_;
    auVar3._24_8_ = local_300._24_8_;
    auVar4._16_8_ = auStack_570._0_8_;
    auVar4._0_16_ = auVar1;
    auVar4._24_8_ = auStack_570._8_8_;
    local_160 = vpand_avx2(auVar3,auVar4);
    local_164 = 1;
    auVar4 = vpsrlw_avx2(local_160,ZEXT416(1));
    local_688 = 0;
    local_300 = auVar24;
    auVar18 = auVar1;
    auVar19 = auVar2;
    for (local_684 = 0; uVar7 = uStack_528, uVar6 = uStack_530, uVar5 = uStack_538, local_684 < 0x20
        ; local_684 = local_684 + 0x10) {
      local_68c = local_648 - local_684;
      local_580 = auVar1;
      auStack_570 = auVar2;
      local_1e0 = auVar24._0_16_;
      auStack_1d0 = auVar24._16_16_;
      local_200 = auVar18;
      auStack_1f0 = auVar19;
      if (local_68c < 1) {
        lVar23 = (long)local_688;
        local_620[lVar23 * 4] = local_540;
        local_620[lVar23 * 4 + 1] = uVar5;
        local_620[lVar23 * 4 + 2] = uVar6;
        *(undefined8 *)(local_600 + lVar23 * 0x20 + -8) = uVar7;
        auVar1 = local_580;
        auVar2 = auStack_570;
        auVar24._0_16_ = local_1e0;
        auVar24._16_16_ = auStack_1d0;
        auVar18 = local_200;
        auVar19 = auStack_1f0;
      }
      else {
        local_1b0 = (undefined1 (*) [16])(local_478 + iVar20 + (long)local_684);
        local_630 = *(undefined8 *)*local_1b0;
        uStack_628 = *(undefined8 *)(*local_1b0 + 8);
        local_1b8 = (undefined1 (*) [16])((long)local_684 + 1 + local_478 + iVar20);
        local_640 = *(undefined8 *)*local_1b8;
        uStack_638 = *(undefined8 *)(*local_1b8 + 8);
        local_4c0 = vpmovzxbw_avx2(*local_1b0);
        local_4e0 = vpmovzxbw_avx2(*local_1b8);
        local_220 = local_4e0._0_8_;
        uStack_218 = local_4e0._8_8_;
        uStack_210 = local_4e0._16_8_;
        uStack_208 = local_4e0._24_8_;
        local_240 = local_4c0._0_8_;
        uStack_238 = local_4c0._8_8_;
        uStack_230 = local_4c0._16_8_;
        uStack_228 = local_4c0._24_8_;
        local_560 = vpsubw_avx2(local_4e0,local_4c0);
        local_120 = local_4c0._0_8_;
        uStack_118 = local_4c0._8_8_;
        uStack_110 = local_4c0._16_8_;
        uStack_108 = local_4c0._24_8_;
        local_124 = 5;
        auVar24 = vpsllw_avx2(local_4c0,ZEXT416(5));
        local_500._0_8_ = auVar24._0_8_;
        local_500._8_8_ = auVar24._8_8_;
        local_500._16_8_ = auVar24._16_8_;
        local_500._24_8_ = auVar24._24_8_;
        local_400 = local_500._0_8_;
        uStack_3f8 = local_500._8_8_;
        uStack_3f0 = local_500._16_8_;
        uStack_3e8 = local_500._24_8_;
        local_420 = local_520;
        uStack_418 = uStack_518;
        uStack_410 = uStack_510;
        uStack_408 = uStack_508;
        auVar15._8_8_ = uStack_518;
        auVar15._0_8_ = local_520;
        auVar15._16_8_ = uStack_510;
        auVar15._24_8_ = uStack_508;
        local_500 = vpaddw_avx2(auVar24,auVar15);
        local_680._0_8_ = auVar4._0_8_;
        local_680._8_8_ = auVar4._8_8_;
        local_680._16_8_ = auVar4._16_8_;
        local_680._24_8_ = auVar4._24_8_;
        local_e0 = local_560._0_8_;
        uStack_d8 = local_560._8_8_;
        uStack_d0 = local_560._16_8_;
        uStack_c8 = local_560._24_8_;
        local_100 = local_680._0_8_;
        uStack_f8 = local_680._8_8_;
        uStack_f0 = local_680._16_8_;
        uStack_e8 = local_680._24_8_;
        local_5c0 = vpmullw_avx2(local_560,auVar4);
        local_440 = local_500._0_8_;
        uStack_438 = local_500._8_8_;
        uStack_430 = local_500._16_8_;
        uStack_428 = local_500._24_8_;
        local_460 = local_5c0._0_8_;
        uStack_458 = local_5c0._8_8_;
        uStack_450 = local_5c0._16_8_;
        uStack_448 = local_5c0._24_8_;
        auVar24 = vpaddw_avx2(local_500,local_5c0);
        local_5e0._0_8_ = auVar24._0_8_;
        local_5e0._8_8_ = auVar24._8_8_;
        local_5e0._16_8_ = auVar24._16_8_;
        local_5e0._24_8_ = auVar24._24_8_;
        local_1a0 = local_5e0._0_8_;
        uStack_198 = local_5e0._8_8_;
        uStack_190 = local_5e0._16_8_;
        uStack_188 = local_5e0._24_8_;
        local_1a4 = 5;
        local_5e0 = vpsrlw_avx2(auVar24,ZEXT416(5));
        local_390 = local_5e0._16_8_;
        uStack_388 = local_5e0._24_8_;
        local_260 = local_5e0._0_8_;
        uStack_258 = local_5e0._8_8_;
        uStack_250 = local_5e0._16_8_;
        uStack_248 = local_5e0._24_8_;
        local_280 = ZEXT1632(local_5e0._16_16_);
        auVar24 = vpackuswb_avx2(local_5e0,local_280);
        local_50 = local_640;
        uStack_48 = uStack_638;
        local_40 = local_630;
        uStack_38 = uStack_628;
        *(undefined1 (*) [32])(local_620 + (long)local_688 * 4) = auVar24;
        auVar1 = local_580;
        auVar2 = auStack_570;
        auVar24._0_16_ = local_1e0;
        auVar24._16_16_ = auStack_1d0;
        auVar18 = local_200;
        auVar19 = auStack_1f0;
      }
      local_688 = local_688 + 1;
    }
    uVar5 = local_600._0_8_;
    uVar6 = local_600._8_8_;
    uVar7 = local_600._16_8_;
    uVar8 = local_600._24_8_;
    auVar25._0_16_ = ZEXT116(0) * local_600._0_16_ + ZEXT116(1) * local_620._0_16_;
    auVar25._16_16_ = ZEXT116(0) * local_620._16_16_ + ZEXT116(1) * local_600._0_16_;
    local_600._16_8_ = auVar25._16_8_;
    uVar9 = local_600._16_8_;
    local_600._24_8_ = auVar25._24_8_;
    uVar10 = local_600._24_8_;
    lVar23 = (long)local_648;
    uVar11 = *(undefined8 *)BaseMask[lVar23];
    uVar12 = *(undefined8 *)(BaseMask[lVar23] + 8);
    uVar13 = *(undefined8 *)(BaseMask[lVar23] + 0x10);
    uVar14 = *(undefined8 *)(BaseMask[lVar23] + 0x18);
    auVar17._8_8_ = uStack_538;
    auVar17._0_8_ = local_540;
    auVar17._16_8_ = uStack_530;
    auVar17._24_8_ = uStack_528;
    auVar16._16_8_ = local_600._16_8_;
    auVar16._0_16_ = auVar25._0_16_;
    auVar16._24_8_ = local_600._24_8_;
    auVar3 = vpblendvb_avx2(auVar17,auVar16,(undefined1  [32])BaseMask[lVar23]);
    *(undefined1 (*) [32])(local_470 + (long)local_588 * 0x20) = auVar3;
    local_584 = local_480 + local_584;
    local_588 = local_588 + 1;
    local_680 = auVar4;
    local_600 = auVar25;
    local_3c0 = uVar5;
    uStack_3b8 = uVar6;
    uStack_3b0 = uVar7;
    uStack_3a8 = uVar8;
    local_c0 = uVar11;
    uStack_b8 = uVar12;
    uStack_b0 = uVar13;
    uStack_a8 = uVar14;
    uStack_90 = uVar9;
    uStack_88 = uVar10;
    local_80 = local_540;
    uStack_78 = uStack_538;
    uStack_70 = uStack_530;
    uStack_68 = uStack_528;
  }
  for (local_64c = local_588; local_64c < local_464; local_64c = local_64c + 1) {
    puVar22 = (undefined8 *)(local_470 + (long)local_64c * 0x20);
    *puVar22 = local_540;
    puVar22[1] = uStack_538;
    puVar22[2] = uStack_530;
    puVar22[3] = uStack_528;
  }
LAB_003a5d1b:
  local_710 = in_RSI;
  local_708 = in_RDI;
  local_580 = auVar1;
  auStack_570 = auVar2;
  local_1e0 = auVar24._0_16_;
  auStack_1d0 = auVar24._16_16_;
  local_a0 = auVar25._0_16_;
  local_200 = auVar18;
  auStack_1f0 = auVar19;
  transpose16x32_avx2(in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
  for (local_b24 = 0; local_b24 < 0x10; local_b24 = local_b24 + 1) {
    lVar23 = (long)local_b24;
    puVar22 = (undefined8 *)(local_708 + lVar23 * local_710);
    uVar5 = local_b20[lVar23 * 4 + 1];
    *puVar22 = local_b20[lVar23 * 4];
    puVar22[1] = uVar5;
    puVar22 = (undefined8 *)(local_708 + (local_b24 + 0x10) * local_710);
    uVar5 = local_b20[(long)local_b24 * 4 + 3];
    *puVar22 = local_b20[(long)local_b24 * 4 + 2];
    puVar22[1] = uVar5;
  }
  return;
}

Assistant:

static void dr_prediction_z3_16x32_avx2(uint8_t *dst, ptrdiff_t stride,
                                        const uint8_t *left, int upsample_left,
                                        int dy) {
  __m256i dstvec[16], d[16];

  dr_prediction_z1_32xN_internal_avx2(16, dstvec, left, upsample_left, dy);
  transpose16x32_avx2(dstvec, d);
  // store
  for (int j = 0; j < 16; j++) {
    _mm_storeu_si128((__m128i *)(dst + j * stride),
                     _mm256_castsi256_si128(d[j]));
    _mm_storeu_si128((__m128i *)(dst + (j + 16) * stride),
                     _mm256_extracti128_si256(d[j], 1));
  }
}